

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O1

void Abc_ObjPatchFanin(Abc_Obj_t *pObj,Abc_Obj_t *pFaninOld,Abc_Obj_t *pFaninNew)

{
  int iVar1;
  int *piVar2;
  Mem_Step_t *p;
  uint uVar3;
  char *pcVar4;
  int *piVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  Abc_Obj_t *pAVar12;
  bool bVar13;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                  ,0xb0,"void Abc_ObjPatchFanin(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *)");
  }
  if (((ulong)pFaninOld & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pFaninOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                  ,0xb1,"void Abc_ObjPatchFanin(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *)");
  }
  pAVar12 = (Abc_Obj_t *)((ulong)pFaninNew & 0xfffffffffffffffe);
  if (pAVar12 == pFaninOld) {
    __assert_fail("pFaninOld != pFaninNewR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                  ,0xb2,"void Abc_ObjPatchFanin(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *)");
  }
  if (pObj->pNtk != pFaninOld->pNtk) {
    __assert_fail("pObj->pNtk == pFaninOld->pNtk",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                  ,0xb5,"void Abc_ObjPatchFanin(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *)");
  }
  if (pObj->pNtk != pAVar12->pNtk) {
    __assert_fail("pObj->pNtk == pFaninNewR->pNtk",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                  ,0xb6,"void Abc_ObjPatchFanin(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *)");
  }
  iVar10 = (pObj->vFanins).nSize;
  uVar3 = 0xffffffff;
  if (0 < (long)iVar10) {
    lVar8 = 0;
    do {
      if ((pObj->vFanins).pArray[lVar8] == pFaninOld->Id) {
        uVar3 = (uint)lVar8;
        break;
      }
      lVar8 = lVar8 + 1;
    } while (iVar10 != lVar8);
  }
  if (uVar3 == 0xffffffff) {
    pcVar4 = Abc_ObjName(pFaninOld);
    printf("Node %s is not among",pcVar4);
    pcVar4 = Abc_ObjName(pObj);
    printf(" the fanins of node %s...\n",pcVar4);
    return;
  }
  if (((int)uVar3 < 0) || (iVar10 <= (int)uVar3)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (pObj->vFanins).pArray[uVar3] = pAVar12->Id;
  if (((ulong)pFaninNew & 1) != 0) {
    if (1 < uVar3) {
      __assert_fail("i >=0 && i < 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                    ,0x17f,"void Abc_ObjXorFaninC(Abc_Obj_t *, int)");
    }
    *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 ^ (uint)(uVar3 != 0) * 0x400 + 0x400;
  }
  uVar3 = (pFaninOld->vFanouts).nSize;
  uVar7 = 0;
  bVar13 = 0 < (int)uVar3;
  if (0 < (int)uVar3) {
    piVar5 = (pFaninOld->vFanouts).pArray;
    bVar13 = true;
    if (*piVar5 != pObj->Id) {
      uVar11 = 0;
      do {
        if ((ulong)uVar3 - 1 == uVar11) {
          bVar13 = false;
          uVar7 = (ulong)uVar3;
          goto LAB_00840e7f;
        }
        uVar7 = uVar11 + 1;
        lVar8 = uVar11 + 1;
        uVar11 = uVar7;
      } while (piVar5[lVar8] != pObj->Id);
      bVar13 = uVar7 < uVar3;
    }
  }
LAB_00840e7f:
  uVar6 = (uint)uVar7;
  if (uVar6 != uVar3) {
    if (!bVar13) {
      __assert_fail("i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
    }
    uVar9 = uVar3;
    if ((int)(uVar6 + 1) < (int)uVar3) {
      piVar2 = (pFaninOld->vFanouts).pArray;
      piVar5 = piVar2 + (uVar6 + 1);
      uVar7 = uVar7 & 0xffffffff;
      do {
        iVar10 = (int)uVar7;
        piVar2[uVar7] = *piVar5;
        uVar9 = (pFaninOld->vFanouts).nSize;
        piVar5 = piVar5 + 1;
        uVar7 = (ulong)(iVar10 + 1);
      } while (iVar10 + 2 < (int)uVar9);
    }
    (pFaninOld->vFanouts).nSize = uVar9 - 1;
    if (uVar6 != uVar3) goto LAB_00840efe;
  }
  pcVar4 = Abc_ObjName(pObj);
  printf("Node %s is not among",pcVar4);
  pcVar4 = Abc_ObjName(pFaninOld);
  printf(" the fanouts of its old fanin %s...\n",pcVar4);
LAB_00840efe:
  iVar10 = pObj->Id;
  iVar1 = (pAVar12->vFanouts).nSize;
  if (iVar1 == (pAVar12->vFanouts).nCap) {
    p = pObj->pNtk->pMmStep;
    if (iVar1 == 0) {
      (pAVar12->vFanouts).nCap = 1;
    }
    iVar1 = (pAVar12->vFanouts).nCap;
    if (p == (Mem_Step_t *)0x0) {
      piVar5 = (int *)malloc((long)iVar1 << 3);
    }
    else {
      piVar5 = (int *)Mem_StepEntryFetch(p,iVar1 << 3);
    }
    piVar2 = (pAVar12->vFanouts).pArray;
    if (piVar2 != (int *)0x0) {
      if (0 < (pAVar12->vFanouts).nSize) {
        lVar8 = 0;
        do {
          piVar5[lVar8] = piVar2[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 < (pAVar12->vFanouts).nSize);
      }
      if (p == (Mem_Step_t *)0x0) {
        free(piVar2);
        (pAVar12->vFanouts).pArray = (int *)0x0;
      }
      else {
        Mem_StepEntryRecycle(p,(char *)piVar2,(pAVar12->vFanouts).nCap << 2);
      }
    }
    (pAVar12->vFanouts).nCap = (pAVar12->vFanouts).nCap << 1;
    (pAVar12->vFanouts).pArray = piVar5;
  }
  iVar1 = (pAVar12->vFanouts).nSize;
  (pAVar12->vFanouts).nSize = iVar1 + 1;
  (pAVar12->vFanouts).pArray[iVar1] = iVar10;
  return;
}

Assistant:

void Abc_ObjPatchFanin( Abc_Obj_t * pObj, Abc_Obj_t * pFaninOld, Abc_Obj_t * pFaninNew )
{
    Abc_Obj_t * pFaninNewR = Abc_ObjRegular(pFaninNew);
    int iFanin;//, nLats;//, fCompl;
    assert( !Abc_ObjIsComplement(pObj) );
    assert( !Abc_ObjIsComplement(pFaninOld) );
    assert( pFaninOld != pFaninNewR );
//    assert( pObj != pFaninOld );
//    assert( pObj != pFaninNewR );
    assert( pObj->pNtk == pFaninOld->pNtk );
    assert( pObj->pNtk == pFaninNewR->pNtk );
    if ( (iFanin = Vec_IntFind( &pObj->vFanins, pFaninOld->Id )) == -1 )
    {
        printf( "Node %s is not among", Abc_ObjName(pFaninOld) );
        printf( " the fanins of node %s...\n", Abc_ObjName(pObj) );
        return;
    }

    // remember the attributes of the old fanin
//    fCompl = Abc_ObjFaninC(pObj, iFanin);
    // replace the old fanin entry by the new fanin entry (removes attributes)
    Vec_IntWriteEntry( &pObj->vFanins, iFanin, pFaninNewR->Id );
    // set the attributes of the new fanin
//    if ( fCompl ^ Abc_ObjIsComplement(pFaninNew) )
//        Abc_ObjSetFaninC( pObj, iFanin );
    if ( Abc_ObjIsComplement(pFaninNew) )
        Abc_ObjXorFaninC( pObj, iFanin );

//    if ( Abc_NtkIsSeq(pObj->pNtk) && (nLats = Seq_ObjFaninL(pObj, iFanin)) )
//        Seq_ObjSetFaninL( pObj, iFanin, nLats );
    // update the fanout of the fanin
    if ( !Vec_IntRemove( &pFaninOld->vFanouts, pObj->Id ) )
    {
        printf( "Node %s is not among", Abc_ObjName(pObj) );
        printf( " the fanouts of its old fanin %s...\n", Abc_ObjName(pFaninOld) );
//        return;
    }
    Vec_IntPushMem( pObj->pNtk->pMmStep, &pFaninNewR->vFanouts, pObj->Id );
}